

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O2

void OpenSteer::
     PointToPathAlikeMapping<OpenSteer::PolylineSegmentedPathwaySegmentRadii,_OpenSteer::PointToPathMapping,_OpenSteer::PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySegmentRadii>_>
     ::map(PolylineSegmentedPathwaySegmentRadii *pathAlike,Vec3 *queryPoint,
          PointToPathMapping *mapping)

{
  int iVar1;
  undefined4 extraout_var;
  size_type segmentIndex;
  size_type segmentIndex_00;
  float distancePointToPath;
  float local_6c;
  float radius;
  float segmentDistance;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
  local_6c = 3.4028235e+38;
  for (segmentIndex_00 = 0; CONCAT44(extraout_var,iVar1) != segmentIndex_00;
      segmentIndex_00 = segmentIndex_00 + 1) {
    segmentDistance = 0.0;
    radius = 0.0;
    distancePointToPath = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    local_60.x = 0.0;
    local_60.y = 0.0;
    local_60.z = 0.0;
    PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySegmentRadii>::
    extract(pathAlike,segmentIndex_00,queryPoint,&segmentDistance,&radius,&distancePointToPath,
            &local_50,&local_60);
    if (distancePointToPath < local_6c) {
      (mapping->pointOnPathCenterLine).x = local_50.x;
      (mapping->pointOnPathCenterLine).y = local_50.y;
      (mapping->pointOnPathCenterLine).z = local_50.z;
      local_6c = distancePointToPath;
      local_40 = Vec3::operator-(queryPoint,&local_50);
      Vec3::normalize(&local_40);
      (mapping->tangent).x = local_60.x;
      (mapping->tangent).y = local_60.y;
      (mapping->tangent).z = local_60.z;
      mapping->distancePointToPath = distancePointToPath;
    }
    (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])
              (pathAlike,segmentIndex_00);
  }
  return;
}

Assistant:

static void map( PathAlike const& pathAlike, Vec3 const& queryPoint, Mapping& mapping ) {
            float minDistancePointToPath = std::numeric_limits< float >::max();
            mapping.setDistanceOnPathFlag( 0.0f );
            
            typedef typename PathAlike::size_type size_type;
            size_type const segmentCount = pathAlike.segmentCount();
            for ( size_type segmentIndex = 0; segmentIndex < segmentCount; ++segmentIndex ) {
                
                float segmentDistance = 0.0f;
                float radius = 0.0f;
                float distancePointToPath = 0.0f;
                Vec3 pointOnPathCenterLine( 0.0f, 0.0f, 0.0f );
                Vec3 tangent( 0.0f, 0.0f, 0.0f );
                
                BaseDataExtractionPolicy::extract( pathAlike, segmentIndex, queryPoint, segmentDistance, radius, distancePointToPath, pointOnPathCenterLine, tangent );
                
                if ( distancePointToPath < minDistancePointToPath ) {
                    minDistancePointToPath = distancePointToPath;
                    mapping.setPointOnPathCenterLine( pointOnPathCenterLine );
                    mapping.setPointOnPathBoundary( pointOnPathCenterLine + ( ( queryPoint - pointOnPathCenterLine ).normalize() * radius ) );
                    mapping.setRadius( radius );
                    mapping.setTangent( tangent );
                    mapping.setSegmentIndex( segmentIndex );
                    mapping.setDistancePointToPath( distancePointToPath );
                    mapping.setDistancePointToPathCenterLine( distancePointToPath + radius );
                    mapping.setDistanceOnPath( mapping.distanceOnPathFlag() + segmentDistance );
                    mapping.setDistanceOnSegment( segmentDistance );
                }
                
                mapping.setDistanceOnPathFlag( mapping.distanceOnPathFlag() + pathAlike.segmentLength( segmentIndex ) );
            }
        }